

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

IdHideMap * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectFieldsAux(Interpreter *this,HeapObject *obj_)

{
  Hide HVar1;
  bool bVar2;
  mapped_type *pmVar3;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  *this_00;
  pointer ppVar4;
  _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *this_01;
  Interpreter *in_RDX;
  IdHideMap *in_RDI;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  *f_1;
  const_iterator __end6;
  const_iterator __begin6;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *__range6;
  HeapComprehensionObject *obj_2;
  iterator it;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide> *pair;
  iterator __end5;
  iterator __begin5;
  IdHideMap *__range5;
  HeapExtendedObject *obj_1;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>
  *f;
  const_iterator __end4;
  const_iterator __begin4;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  *__range4;
  HeapSimpleObject *obj;
  IdHideMap *r;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_stack_fffffffffffffe58;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  *in_stack_fffffffffffffe60;
  key_type *in_stack_fffffffffffffe98;
  key_type *__k;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  *in_stack_fffffffffffffea0;
  long local_140;
  _Self local_110;
  _Self local_108;
  _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *local_100;
  _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *local_f8;
  _Self local_f0;
  _Self local_e8;
  reference local_e0;
  _Self local_d8;
  _Self local_d0;
  undefined1 local_c8 [48];
  undefined1 *local_98;
  key_type local_90 [6];
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  *local_60;
  reference local_48;
  _Self local_40;
  _Self local_38;
  long local_30;
  long local_28;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar5;
  
  uVar5 = 0;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
         *)0x23b549);
  if (in_RDX == (Interpreter *)0x0) {
    local_140 = 0;
  }
  else {
    local_140 = __dynamic_cast(in_RDX,&(anonymous_namespace)::HeapObject::typeinfo,
                               &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
  }
  local_28 = local_140;
  if (local_140 == 0) {
    if (in_RDX == (Interpreter *)0x0) {
      this_00 = (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                 *)0x0;
    }
    else {
      this_00 = (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                 *)__dynamic_cast(in_RDX,&(anonymous_namespace)::HeapObject::typeinfo,
                                  &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
    }
    local_60 = this_00;
    if (this_00 ==
        (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
         *)0x0) {
      if (in_RDX == (Interpreter *)0x0) {
        this_01 = (_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)0x0;
      }
      else {
        this_01 = (_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)__dynamic_cast(in_RDX,&(anonymous_namespace)::HeapObject::typeinfo,
                                    &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
      }
      if (this_01 !=
          (_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
           *)0x0) {
        local_100 = this_01 + 10;
        local_f8 = this_01;
        local_108._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::begin(in_stack_fffffffffffffe58);
        local_110._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
             ::end(in_stack_fffffffffffffe58);
        while (bVar2 = std::operator!=(&local_108,&local_110), bVar2) {
          std::
          _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ::operator*(this_01);
          pmVar3 = std::
                   map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                   ::operator[](this_00,in_stack_fffffffffffffe98);
          *pmVar3 = INHERIT;
          std::
          _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ::operator++(this_01);
        }
      }
    }
    else {
      objectFieldsAux(in_RDX,(HeapObject *)CONCAT17(uVar5,in_stack_ffffffffffffffe0));
      __k = local_90;
      std::
      map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
      ::operator=(in_stack_fffffffffffffe60,
                  (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                   *)in_stack_fffffffffffffe58);
      std::
      map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
      ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
              *)0x23b70f);
      objectFieldsAux(in_RDX,(HeapObject *)CONCAT17(uVar5,in_stack_ffffffffffffffe0));
      local_98 = local_c8;
      local_d0._M_node =
           (_Base_ptr)
           std::
           map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
           ::begin((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                    *)in_stack_fffffffffffffe58);
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
           ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                  *)in_stack_fffffffffffffe58);
      while (bVar2 = std::operator!=(&local_d0,&local_d8), bVar2) {
        local_e0 = std::
                   _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
                   ::operator*((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
                                *)0x23b7a4);
        local_e8._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
             ::find((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                     *)in_stack_fffffffffffffe58,(key_type *)0x23b7be);
        local_f0._M_node =
             (_Base_ptr)
             std::
             map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
             ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                    *)in_stack_fffffffffffffe58);
        bVar2 = std::operator==(&local_e8,&local_f0);
        if (bVar2) {
          HVar1 = local_e0->second;
          pmVar3 = std::
                   map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                   ::operator[](this_00,__k);
          *pmVar3 = HVar1;
        }
        else {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
                                 *)0x23b85f);
          if (ppVar4->second == INHERIT) {
            HVar1 = local_e0->second;
            pmVar3 = std::
                     map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                     ::operator[](this_00,__k);
            *pmVar3 = HVar1;
          }
        }
        std::
        _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
                      *)in_stack_fffffffffffffe60);
      }
      std::
      map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
      ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
              *)0x23b792);
    }
  }
  else {
    local_30 = local_140 + 0x40;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
         ::begin((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                  *)in_stack_fffffffffffffe58);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
         ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                *)in_stack_fffffffffffffe58);
    while (bVar2 = std::operator!=(&local_38,&local_40), bVar2) {
      local_48 = std::
                 _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>
                              *)in_stack_fffffffffffffe60);
      HVar1 = (local_48->second).hide;
      pmVar3 = std::
               map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
               ::operator[](in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      *pmVar3 = HVar1;
      std::
      _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>
                    *)in_stack_fffffffffffffe60);
    }
  }
  return in_RDI;
}

Assistant:

IdHideMap objectFieldsAux(const HeapObject *obj_)
    {
        IdHideMap r;
        if (auto *obj = dynamic_cast<const HeapSimpleObject *>(obj_)) {
            for (const auto &f : obj->fields) {
                r[f.first] = f.second.hide;
            }

        } else if (auto *obj = dynamic_cast<const HeapExtendedObject *>(obj_)) {
            r = objectFieldsAux(obj->right);
            for (const auto &pair : objectFieldsAux(obj->left)) {
                auto it = r.find(pair.first);
                if (it == r.end()) {
                    // First time it is seen
                    r[pair.first] = pair.second;
                } else if (it->second == ObjectField::INHERIT) {
                    // Seen before, but with inherited visibility so use new visibility
                    r[pair.first] = pair.second;
                }
            }

        } else if (auto *obj = dynamic_cast<const HeapComprehensionObject *>(obj_)) {
            for (const auto &f : obj->compValues)
                r[f.first] = ObjectField::INHERIT;
        }
        return r;
    }